

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O2

int __thiscall unixsocketipc::MessageReceiver::listen(MessageReceiver *this,int __fd,int __n)

{
  bool bVar1;
  int client_socket_fd;
  undefined7 extraout_var;
  uint uVar2;
  undefined8 unaff_RBP;
  ulong uVar3;
  uint remote_length;
  sockaddr_un remote;
  
  if (this->server_socket_fd == 0) {
    uVar2 = 0;
  }
  else {
    ::listen(this->server_socket_fd,1);
    remote_length = 0x6e;
    uVar3 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    while ((char)uVar3 != '\0') {
      client_socket_fd = accept(this->server_socket_fd,(sockaddr *)&remote,&remote_length);
      if (client_socket_fd == -1) break;
      if ((this->on_client_connected).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_()>::operator()(&this->on_client_connected);
      }
      bVar1 = handle_next_client(this,client_socket_fd);
      close(client_socket_fd);
      uVar3 = CONCAT71(extraout_var,bVar1) & 0xffffffff;
    }
    uVar2 = (uint)uVar3 ^ 1;
  }
  return uVar2;
}

Assistant:

bool MessageReceiver::listen() {
   if (!server_socket_fd) {
      DEBUG_MSG("%s: not initialized\n", __FUNCTION__);
      return false;
   }

   // mark socket as listening socket
   ::listen(server_socket_fd, 1); // 1 is max size of waiting connections queue, more connection will be rejected

   sockaddr_un remote;
   unsigned remote_length = sizeof(remote);

   // listen for incoming connections
   bool keep_working = true;
   while (keep_working) {
       DEBUG_MSG("%s: listening for incoming connection...\n", __FUNCTION__);

       // 1. accept new client socket
       int client_socket_fd = accept(server_socket_fd, (sockaddr*)&remote, &remote_length); // remote is filled with remote config
       if (client_socket_fd == -1) {
          DEBUG_MSG("%s: accept failed\n", __FUNCTION__);
          return false;
       }

       // 2. notify about new client connected
       if (on_client_connected)
           on_client_connected();

       // 3. handle the client
       keep_working = handle_next_client(client_socket_fd);

       // 4. communication done. Close the client socket
      ::close(client_socket_fd);
   }

   DEBUG_MSG("%s: listening done\n", __FUNCTION__);
   return true;
}